

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_overflow_strings_to_disk.cpp
# Opt level: O3

void __thiscall
duckdb::UncompressedStringSegmentState::RegisterBlock
          (UncompressedStringSegmentState *this,BlockManager *manager_p,block_id_t block_id)

{
  iterator __position;
  int iVar1;
  iterator iVar2;
  InternalException *this_00;
  shared_ptr<duckdb::BlockHandle,_true> sVar3;
  shared_ptr<duckdb::BlockHandle,_true> result;
  long local_60;
  undefined1 local_58 [16];
  string local_48;
  
  local_60 = block_id;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->block_lock);
  if (iVar1 != 0) {
    ::std::__throw_system_error(iVar1);
  }
  iVar2 = ::std::
          _Hashtable<long,_std::pair<const_long,_duckdb::shared_ptr<duckdb::BlockHandle,_true>_>,_std::allocator<std::pair<const_long,_duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->handles)._M_h,&local_60);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_long,_duckdb::shared_ptr<duckdb::BlockHandle,_true>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    if ((this->block_manager).ptr != (BlockManager *)0x0) {
      optional_ptr<duckdb::BlockManager,_true>::CheckValid(&this->block_manager);
      manager_p = (this->block_manager).ptr;
    }
    sVar3 = BlockManager::RegisterBlock((BlockManager *)local_58,(block_id_t)manager_p);
    local_48._M_dataplus._M_p = (pointer)local_60;
    local_48._M_string_length = local_58._0_8_;
    local_48.field_2._M_allocated_capacity = local_58._8_8_;
    local_58._0_8_ = (_func_int **)0x0;
    local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ::std::
    _Hashtable<long,std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>,std::allocator<std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<long,duckdb::shared_ptr<duckdb::BlockHandle,true>>>
              ((_Hashtable<long,std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>,std::allocator<std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->handles,local_58 + 0x10,
               sVar3.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.field_2._M_allocated_capacity !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_48.field_2._M_allocated_capacity);
    }
    __position._M_current =
         (this->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      ::std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                ((vector<long,std::allocator<long>> *)&this->on_disk_blocks,__position,&local_60);
    }
    else {
      *__position._M_current = local_60;
      (this->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
           __position._M_current + 1;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->block_lock);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_58 + 0x10),
             "UncompressedStringSegmentState::RegisterBlock - block id %llu already exists","");
  InternalException::InternalException<long>(this_00,(string *)(local_58 + 0x10),local_60);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void UncompressedStringSegmentState::RegisterBlock(BlockManager &manager_p, block_id_t block_id) {
	lock_guard<mutex> lock(block_lock);
	auto entry = handles.find(block_id);
	if (entry != handles.end()) {
		throw InternalException("UncompressedStringSegmentState::RegisterBlock - block id %llu already exists",
		                        block_id);
	}
	auto &manager = block_manager ? *block_manager : manager_p;
	auto result = manager.RegisterBlock(block_id);
	handles.insert(make_pair(block_id, std::move(result)));
	on_disk_blocks.push_back(block_id);
}